

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H31_traverse.c
# Opt level: O1

pbtree pop_stack(pbtreestack s)

{
  pbtree pbVar1;
  
  if (s->top == s->base) {
    printf("Error");
  }
  pbVar1 = *s->top;
  s->top = s->top + -1;
  return pbVar1;
}

Assistant:

pbtree pop_stack(pbtreestack s) {
  if (s->top == s->base) {
    printf("Error");
  }
  pbtree e = *(s->top);
  s->top--;
  return e;
  // return *(--(s->top));
}